

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse2.cpp
# Opt level: O0

void qt_blend_rgb32_on_rgb32_sse2
               (uchar *destPixels,int dbpl,uchar *srcPixels,int sbpl,int w,int h,int const_alpha)

{
  short sVar1;
  uint uVar2;
  uint b;
  unsigned_long_long *puVar3;
  ulong *puVar4;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  ulong in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  ushort uVar5;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ulong uVar6;
  ulong uVar7;
  ushort uVar11;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ulong uVar12;
  ulong uVar13;
  short sStack0000000000000008;
  int _i;
  __m128i finalRB;
  __m128i dstVectorRBoneMinusAlphalpha;
  __m128i srcVectorRBalpha;
  __m128i dstVectorRB;
  __m128i srcVectorRB;
  __m128i finalAG;
  __m128i dstVectorAGoneMinusAlphalpha;
  __m128i srcVectorAGalpha;
  __m128i dstVectorAG;
  __m128i srcVectorAG;
  __m128i result;
  __m128i dstVector;
  __m128i srcVector;
  int x;
  int y;
  __m128i oneMinusConstAlpha;
  __m128i constAlphaVector;
  int one_minus_const_alpha;
  __m128i colorMask;
  __m128i half;
  quint32 *dst;
  quint32 *src;
  int in_stack_fffffffffffffb64;
  int iVar17;
  undefined8 in_stack_fffffffffffffb68;
  uchar *in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  uchar *in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb90;
  undefined8 local_448;
  undefined8 uStack_440;
  int local_3c0;
  int local_3bc;
  short local_38c;
  ulong local_368;
  long local_360;
  ushort local_228;
  ushort uStack_226;
  ushort uStack_224;
  ushort uStack_222;
  ushort uStack_220;
  ushort uStack_21e;
  ushort uStack_21c;
  ushort uStack_21a;
  ushort local_208;
  ushort uStack_206;
  ushort uStack_204;
  ushort uStack_202;
  ushort uStack_200;
  ushort uStack_1fe;
  ushort uStack_1fc;
  ushort uStack_1fa;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  ulong local_18;
  unsigned_long_long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_sStack0000000000000008 == 0x100) {
    qt_blend_rgb32_on_rgb32
              (in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
               (int)in_stack_fffffffffffffb68,in_stack_fffffffffffffb64,in_stack_fffffffffffffb90);
  }
  else if (_sStack0000000000000008 != 0) {
    uVar2 = (int)(_sStack0000000000000008 * 0xff) >> 8;
    b = 0xff - uVar2;
    sStack0000000000000008 = (short)(_sStack0000000000000008 * 0xff >> 8);
    sVar1 = sStack0000000000000008;
    local_38c = (short)b;
    _sStack0000000000000008 = uVar2;
    local_368 = in_RDI;
    local_360 = in_RDX;
    for (local_3bc = 0; local_3bc < in_R9D; local_3bc = local_3bc + 1) {
      local_3c0 = 0;
      while( true ) {
        local_10 = (unsigned_long_long)in_R8D;
        local_18 = 4 - (local_368 >> 2 & 3) & 3;
        puVar3 = qMin<unsigned_long_long>(&local_10,&local_18);
        if ((int)*puVar3 <= local_3c0) break;
        uVar2 = INTERPOLATE_PIXEL_255
                          (*(uint *)(local_360 + (long)local_3c0 * 4),_sStack0000000000000008,
                           *(uint *)(local_368 + (long)local_3c0 * 4),b);
        *(uint *)(local_368 + (long)local_3c0 * 4) = uVar2;
        local_3c0 = local_3c0 + 1;
      }
      for (; local_3c0 < in_R8D + -3; local_3c0 = local_3c0 + 4) {
        puVar4 = (ulong *)(local_360 + (long)local_3c0 * 4);
        uVar6 = *puVar4;
        uVar12 = puVar4[1];
        puVar4 = (ulong *)(local_368 + (long)local_3c0 * 4);
        uVar7 = *puVar4;
        uVar13 = puVar4[1];
        local_208 = (ushort)uVar6;
        uStack_206 = (ushort)(uVar6 >> 0x10);
        uStack_204 = (ushort)(uVar6 >> 0x20);
        uStack_200 = (ushort)uVar12;
        uStack_1fe = (ushort)(uVar12 >> 0x10);
        uStack_1fc = (ushort)(uVar12 >> 0x20);
        local_228 = (ushort)uVar7;
        uStack_226 = (ushort)(uVar7 >> 0x10);
        uStack_224 = (ushort)(uVar7 >> 0x20);
        uStack_220 = (ushort)uVar13;
        uStack_21e = (ushort)(uVar13 >> 0x10);
        uStack_21c = (ushort)(uVar13 >> 0x20);
        uVar5 = (local_208 >> 8) * sVar1 + (local_228 >> 8) * local_38c;
        uVar8 = (uStack_206 >> 8) * sVar1 + (uStack_226 >> 8) * local_38c;
        uVar9 = (uStack_204 >> 8) * sVar1 + (uStack_224 >> 8) * local_38c;
        uVar10 = (ushort)(uVar6 >> 0x38) * sVar1 + (ushort)(uVar7 >> 0x38) * local_38c;
        uVar11 = (uStack_200 >> 8) * sVar1 + (uStack_220 >> 8) * local_38c;
        uVar14 = (uStack_1fe >> 8) * sVar1 + (uStack_21e >> 8) * local_38c;
        uVar15 = (uStack_1fc >> 8) * sVar1 + (uStack_21c >> 8) * local_38c;
        uVar16 = (ushort)(uVar12 >> 0x38) * sVar1 + (ushort)(uVar13 >> 0x38) * local_38c;
        local_448 = CONCAT26(uVar10 + (uVar10 >> 8) + 0x80,
                             CONCAT24(uVar9 + (uVar9 >> 8) + 0x80,
                                      CONCAT22(uVar8 + (uVar8 >> 8) + 0x80,
                                               uVar5 + (uVar5 >> 8) + 0x80)));
        uStack_440 = CONCAT26(uVar16 + (uVar16 >> 8) + 0x80,
                              CONCAT24(uVar15 + (uVar15 >> 8) + 0x80,
                                       CONCAT22(uVar14 + (uVar14 >> 8) + 0x80,
                                                uVar11 + (uVar11 >> 8) + 0x80)));
        uVar6 = uVar6 & 0xff00ff00ff00ff;
        uVar12 = uVar12 & 0xff00ff00ff00ff;
        uVar7 = uVar7 & 0xff00ff00ff00ff;
        uVar13 = uVar13 & 0xff00ff00ff00ff;
        local_1c8 = (short)uVar6;
        sStack_1c6 = (short)(uVar6 >> 0x10);
        sStack_1c4 = (short)(uVar6 >> 0x20);
        sStack_1c2 = (short)(uVar6 >> 0x30);
        sStack_1c0 = (short)uVar12;
        sStack_1be = (short)(uVar12 >> 0x10);
        sStack_1bc = (short)(uVar12 >> 0x20);
        sStack_1ba = (short)(uVar12 >> 0x30);
        local_1e8 = (short)uVar7;
        sStack_1e6 = (short)(uVar7 >> 0x10);
        sStack_1e4 = (short)(uVar7 >> 0x20);
        sStack_1e2 = (short)(uVar7 >> 0x30);
        sStack_1e0 = (short)uVar13;
        sStack_1de = (short)(uVar13 >> 0x10);
        sStack_1dc = (short)(uVar13 >> 0x20);
        sStack_1da = (short)(uVar13 >> 0x30);
        uVar5 = local_1c8 * sVar1 + local_1e8 * local_38c;
        uVar8 = sStack_1c6 * sVar1 + sStack_1e6 * local_38c;
        uVar9 = sStack_1c4 * sVar1 + sStack_1e4 * local_38c;
        uVar10 = sStack_1c2 * sVar1 + sStack_1e2 * local_38c;
        uVar11 = sStack_1c0 * sVar1 + sStack_1e0 * local_38c;
        uVar14 = sStack_1be * sVar1 + sStack_1de * local_38c;
        uVar15 = sStack_1bc * sVar1 + sStack_1dc * local_38c;
        uVar16 = sStack_1ba * sVar1 + sStack_1da * local_38c;
        puVar4 = (ulong *)(local_368 + (long)local_3c0 * 4);
        *puVar4 = local_448 & 0xff00ff00ff00ff00 |
                  CONCAT26((ushort)(uVar10 + (uVar10 >> 8) + 0x80) >> 8,
                           CONCAT24((ushort)(uVar9 + (uVar9 >> 8) + 0x80) >> 8,
                                    CONCAT22((ushort)(uVar8 + (uVar8 >> 8) + 0x80) >> 8,
                                             (ushort)(uVar5 + (uVar5 >> 8) + 0x80) >> 8)));
        puVar4[1] = uStack_440 & 0xff00ff00ff00ff00 |
                    CONCAT26((ushort)(uVar16 + (uVar16 >> 8) + 0x80) >> 8,
                             CONCAT24((ushort)(uVar15 + (uVar15 >> 8) + 0x80) >> 8,
                                      CONCAT22((ushort)(uVar14 + (uVar14 >> 8) + 0x80) >> 8,
                                               (ushort)(uVar11 + (uVar11 >> 8) + 0x80) >> 8)));
      }
      for (iVar17 = 0; iVar17 < 3 && local_3c0 < in_R8D; iVar17 = iVar17 + 1) {
        uVar2 = INTERPOLATE_PIXEL_255
                          (*(uint *)(local_360 + (long)local_3c0 * 4),_sStack0000000000000008,
                           *(uint *)(local_368 + (long)local_3c0 * 4),b);
        *(uint *)(local_368 + (long)local_3c0 * 4) = uVar2;
        local_3c0 = local_3c0 + 1;
      }
      local_368 = local_368 + (long)in_ESI;
      local_360 = local_360 + in_ECX;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_blend_rgb32_on_rgb32_sse2(uchar *destPixels, int dbpl,
                                 const uchar *srcPixels, int sbpl,
                                 int w, int h,
                                 int const_alpha)
{
    const quint32 *src = (const quint32 *) srcPixels;
    quint32 *dst = (quint32 *) destPixels;
    if (const_alpha != 256) {
        if (const_alpha != 0) {
            const __m128i half = _mm_set1_epi16(0x80);
            const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);

            const_alpha = (const_alpha * 255) >> 8;
            int one_minus_const_alpha = 255 - const_alpha;
            const __m128i constAlphaVector = _mm_set1_epi16(const_alpha);
            const __m128i oneMinusConstAlpha =  _mm_set1_epi16(one_minus_const_alpha);
            for (int y = 0; y < h; ++y) {
                int x = 0;

                // First, align dest to 16 bytes:
                ALIGNMENT_PROLOGUE_16BYTES(dst, x, w) {
                    dst[x] = INTERPOLATE_PIXEL_255(src[x], const_alpha, dst[x], one_minus_const_alpha);
                }

                for (; x < w-3; x += 4) {
                    __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[x]);
                    const __m128i dstVector = _mm_load_si128((__m128i *)&dst[x]);
                    __m128i result;
                    INTERPOLATE_PIXEL_255_SSE2(result, srcVector, dstVector, constAlphaVector, oneMinusConstAlpha, colorMask, half);
                    _mm_store_si128((__m128i *)&dst[x], result);
                }
                SIMD_EPILOGUE(x, w, 3)
                    dst[x] = INTERPOLATE_PIXEL_255(src[x], const_alpha, dst[x], one_minus_const_alpha);
                dst = (quint32 *)(((uchar *) dst) + dbpl);
                src = (const quint32 *)(((const uchar *) src) + sbpl);
            }
        }
    } else {
        qt_blend_rgb32_on_rgb32(destPixels, dbpl, srcPixels, sbpl, w, h, const_alpha);
    }
}